

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate-names.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_17::NameGenerator::BeginLoopExpr(NameGenerator *this,LoopExpr *expr)

{
  Index index;
  LoopExpr *expr_local;
  NameGenerator *this_local;
  
  index = this->label_count_;
  this->label_count_ = index + 1;
  MaybeGenerateName("$L",index,&(expr->block).label);
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result NameGenerator::BeginLoopExpr(LoopExpr* expr) {
  MaybeGenerateName("$L", label_count_++, &expr->block.label);
  return Result::Ok;
}